

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiStyle::ScaleAllSizes(ImGuiStyle *this,float scale_factor)

{
  uint uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  
  IVar2.x = (float)(int)((this->WindowPadding).x * scale_factor);
  IVar2.y = (float)(int)((this->WindowPadding).y * scale_factor);
  this->WindowPadding = IVar2;
  this->WindowRounding = (float)(int)(this->WindowRounding * scale_factor);
  IVar3.x = (float)(int)((this->WindowMinSize).x * scale_factor);
  IVar3.y = (float)(int)((this->WindowMinSize).y * scale_factor);
  this->WindowMinSize = IVar3;
  this->ChildRounding = (float)(int)(this->ChildRounding * scale_factor);
  this->PopupRounding = (float)(int)(this->PopupRounding * scale_factor);
  IVar4.x = (float)(int)((this->FramePadding).x * scale_factor);
  IVar4.y = (float)(int)((this->FramePadding).y * scale_factor);
  this->FramePadding = IVar4;
  this->FrameRounding = (float)(int)(this->FrameRounding * scale_factor);
  IVar5.x = (float)(int)((this->ItemSpacing).x * scale_factor);
  IVar5.y = (float)(int)((this->ItemSpacing).y * scale_factor);
  this->ItemSpacing = IVar5;
  IVar6.x = (float)(int)((this->ItemInnerSpacing).x * scale_factor);
  IVar6.y = (float)(int)((this->ItemInnerSpacing).y * scale_factor);
  this->ItemInnerSpacing = IVar6;
  IVar7.x = (float)(int)((this->TouchExtraPadding).x * scale_factor);
  IVar7.y = (float)(int)((this->TouchExtraPadding).y * scale_factor);
  this->TouchExtraPadding = IVar7;
  this->IndentSpacing = (float)(int)(this->IndentSpacing * scale_factor);
  this->ColumnsMinSpacing = (float)(int)(this->ColumnsMinSpacing * scale_factor);
  this->ScrollbarSize = (float)(int)(this->ScrollbarSize * scale_factor);
  this->ScrollbarRounding = (float)(int)(this->ScrollbarRounding * scale_factor);
  this->GrabMinSize = (float)(int)(this->GrabMinSize * scale_factor);
  this->GrabRounding = (float)(int)(this->GrabRounding * scale_factor);
  this->LogSliderDeadzone = (float)(int)(this->LogSliderDeadzone * scale_factor);
  this->TabRounding = (float)(int)(this->TabRounding * scale_factor);
  uVar1 = -(uint)(this->TabMinWidthForCloseButton != 3.4028235e+38);
  this->TabMinWidthForCloseButton =
       (float)(~uVar1 & 0x7f7fffff |
              (uint)(float)(int)(this->TabMinWidthForCloseButton * scale_factor) & uVar1);
  IVar8.x = (float)(int)((this->DisplayWindowPadding).x * scale_factor);
  IVar8.y = (float)(int)((this->DisplayWindowPadding).y * scale_factor);
  this->DisplayWindowPadding = IVar8;
  IVar9.x = (float)(int)((this->DisplaySafeAreaPadding).x * scale_factor);
  IVar9.y = (float)(int)((this->DisplaySafeAreaPadding).y * scale_factor);
  this->DisplaySafeAreaPadding = IVar9;
  this->MouseCursorScale = (float)(int)(scale_factor * this->MouseCursorScale);
  return;
}

Assistant:

void ImGuiStyle::ScaleAllSizes(float scale_factor)
{
    WindowPadding = ImFloor(WindowPadding * scale_factor);
    WindowRounding = ImFloor(WindowRounding * scale_factor);
    WindowMinSize = ImFloor(WindowMinSize * scale_factor);
    ChildRounding = ImFloor(ChildRounding * scale_factor);
    PopupRounding = ImFloor(PopupRounding * scale_factor);
    FramePadding = ImFloor(FramePadding * scale_factor);
    FrameRounding = ImFloor(FrameRounding * scale_factor);
    ItemSpacing = ImFloor(ItemSpacing * scale_factor);
    ItemInnerSpacing = ImFloor(ItemInnerSpacing * scale_factor);
    TouchExtraPadding = ImFloor(TouchExtraPadding * scale_factor);
    IndentSpacing = ImFloor(IndentSpacing * scale_factor);
    ColumnsMinSpacing = ImFloor(ColumnsMinSpacing * scale_factor);
    ScrollbarSize = ImFloor(ScrollbarSize * scale_factor);
    ScrollbarRounding = ImFloor(ScrollbarRounding * scale_factor);
    GrabMinSize = ImFloor(GrabMinSize * scale_factor);
    GrabRounding = ImFloor(GrabRounding * scale_factor);
    LogSliderDeadzone = ImFloor(LogSliderDeadzone * scale_factor);
    TabRounding = ImFloor(TabRounding * scale_factor);
    TabMinWidthForCloseButton = (TabMinWidthForCloseButton != FLT_MAX) ? ImFloor(TabMinWidthForCloseButton * scale_factor) : FLT_MAX;
    DisplayWindowPadding = ImFloor(DisplayWindowPadding * scale_factor);
    DisplaySafeAreaPadding = ImFloor(DisplaySafeAreaPadding * scale_factor);
    MouseCursorScale = ImFloor(MouseCursorScale * scale_factor);
}